

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O3

int ravi_compile_n(lua_State *L)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  byte bVar5;
  lua_Integer *in_RCX;
  lua_Integer in_R8;
  lua_Integer ival;
  Proto *functions [100];
  ravi_compile_options_t local_358;
  int local_350 [2];
  Proto *local_348 [101];
  
  iVar2 = lua_type(L,1);
  if (iVar2 == 5) {
    lua_pushnil(L);
    iVar3 = lua_next(L,1);
    iVar2 = 0;
    while (iVar3 != 0) {
      if (iVar2 < 100) {
        iVar3 = lua_type(L,-1);
        if (iVar3 == 6) {
          iVar3 = lua_iscfunction(L,-1);
          if (iVar3 == 0) {
            pvVar4 = lua_topointer(L,-1);
            if (((*(Proto **)((long)pvVar4 + 0x18))->ravi_jit).jit_function == (lua_CFunction)0x0) {
              in_RCX = (lua_Integer *)(long)iVar2;
              iVar2 = iVar2 + 1;
              local_348[(long)in_RCX] = *(Proto **)((long)pvVar4 + 0x18);
            }
          }
        }
      }
      lua_settop(L,-2);
      iVar3 = lua_next(L,1);
    }
    goto LAB_00132a54;
  }
  iVar2 = lua_type(L,1);
  if (iVar2 == 6) {
    iVar2 = lua_iscfunction(L,1);
    if (iVar2 != 0) goto LAB_00132a25;
  }
  else {
LAB_00132a25:
    luaL_argerror(L,1,"argument must be a Lua function");
  }
  iVar2 = 1;
  pvVar4 = lua_topointer(L,1);
  local_348[0] = *(Proto **)((long)pvVar4 + 0x18);
LAB_00132a54:
  local_358 = (ravi_compile_options_t)0x7;
  iVar3 = lua_type(L,2);
  if (iVar3 == 5) {
    l_table_get_integer(L,0x15abc5,(char *)local_350,in_RCX,in_R8);
    bVar1 = (local_350[0] != 0) * '\x02';
    l_table_get_integer(L,0x15abdc,(char *)local_350,in_RCX,in_R8);
    bVar5 = bVar1 | 1;
    if (local_350[0] != 0) {
      bVar5 = bVar1 | 5;
    }
    local_358._0_1_ = bVar5;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = raviV_compile_n(L,local_348,iVar2,&local_358);
  }
  lua_pushboolean(L,iVar2);
  return 1;
}

Assistant:

static int ravi_compile_n(lua_State *L) {
  enum { MAX_COMPILES = 100 };
  Proto *functions[MAX_COMPILES];
  int n = 0;
  if (lua_istable(L, 1)) {
    lua_pushnil(L);  // push first key
    while (lua_next(L, 1)) {
      if (n < MAX_COMPILES && lua_isfunction(L, -1) &&
          !lua_iscfunction(L, -1)) {
        void *p = (void *)lua_topointer(L, -1);
        LClosure *l = (LClosure *)(p);
        if (!l->p->ravi_jit.jit_function) functions[n++] = l->p;
      }
      lua_pop(L, 1);  // pop value, but keep key
    }
  }
  else {
    luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1), 1,
                  "argument must be a Lua function");
    void *p = (void *)lua_topointer(L, 1);
    LClosure *l = (LClosure *)(p);
    functions[n++] = l->p;
  }
  ravi_compile_options_t options = {0, 0, 0, RAVI_CODEGEN_NONE};
  options.manual_request = 1;
  options.inline_lua_arithmetic_operators = 1;
  options.omit_array_get_range_check = 1;
  if (lua_istable(L, 2)) {
    lua_Integer ival;
    l_table_get_integer(L, 2, "omitArrayGetRangeCheck",
                        &ival, 0);
    options.omit_array_get_range_check = (int)ival ? 1 : 0;
    l_table_get_integer(L, 2, "inlineLuaArithmeticOperators",
                        &ival, 0);
    options.inline_lua_arithmetic_operators = (int)ival ? 1 : 0;
  }
  int result = 0;
  if (n > 0) { result = raviV_compile_n(L, functions, n, &options); }
  lua_pushboolean(L, result);
  return 1;
}